

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O0

void CompiledMixedType<int,unsigned_long_long>(void)

{
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> bits;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> bits_00;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> bits_01;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> bits_02;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs_00;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs_01;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> bits_03;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> bits_04;
  unsigned_long_long u2;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> st2;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> su;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> st;
  bool b;
  int t;
  unsigned_long_long u;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>
  in_stack_fffffffffffffd68;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_fffffffffffffd70;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_fffffffffffffd74;
  undefined4 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd7c;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>
  in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd8c;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_fffffffffffffd90;
  int local_24;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> local_20;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> local_14;
  byte local_d;
  int local_c;
  unsigned_long_long local_8;
  
  local_8 = 0;
  local_c = 0;
  local_d = 0;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<unsigned_long_long>
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int),
             (unsigned_long_long *)in_stack_fffffffffffffd68.m_int);
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt
            (&local_20,&local_8);
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<unsigned_long_long>
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffd80.m_int,
             (SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  local_d = (local_d ^ 0xff) & 1;
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffd80.m_int,
             (int *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffd80.m_int,
             (unsigned_long_long *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int),
             (SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffd68.m_int);
  local_14.m_int = local_24;
  SafeInt::operator_cast_to_unsigned_long_long
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int));
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
             CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int));
  local_c = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int));
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator*
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
             (SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>)
             (int)in_stack_fffffffffffffd80.m_int);
  local_c = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int));
  operator*(CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
            (SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>)
            (int)in_stack_fffffffffffffd80.m_int);
  local_c = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int));
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffd80.m_int,
             CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),in_stack_fffffffffffffd80
            );
  local_8 = 1;
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffd80.m_int,
             (int *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  SafeInt<unsigned_long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffd80.m_int,
             (int *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
             CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int));
  local_c = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int));
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffd80.m_int,
             (int *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
             (SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>)
             (int)in_stack_fffffffffffffd80.m_int);
  local_c = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int));
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int),
             in_stack_fffffffffffffd68.m_int);
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),in_stack_fffffffffffffd80
            );
  local_8 = 1;
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffd80.m_int,
             (int *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffd80.m_int,
             (int *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
             CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int));
  local_c = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int));
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator/
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
             (SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>)
             (int)in_stack_fffffffffffffd80.m_int);
  local_c = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int));
  operator/(CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),in_stack_fffffffffffffd90)
  ;
  local_c = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int));
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffd80.m_int,
             CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),in_stack_fffffffffffffd80
            );
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
             CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int));
  local_c = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int));
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator+
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
             (SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>)
             (int)in_stack_fffffffffffffd80.m_int);
  local_c = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int));
  operator+(in_stack_fffffffffffffd68.m_int,in_stack_fffffffffffffd70);
  local_c = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int));
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int),
             in_stack_fffffffffffffd68.m_int);
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),in_stack_fffffffffffffd80
            );
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffd80.m_int,
             (int *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  local_8 = 0;
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffd80.m_int,
             (int *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
             CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int));
  local_c = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int));
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator-
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
             (SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>)
             (int)in_stack_fffffffffffffd80.m_int);
  local_c = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int));
  operator-(in_stack_fffffffffffffd68.m_int,in_stack_fffffffffffffd70);
  local_c = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int));
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int),
             in_stack_fffffffffffffd68.m_int);
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffd80.m_int,
             (int *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  SafeInt<unsigned_long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffd80.m_int,
             (int *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),in_stack_fffffffffffffd80
            );
  local_8 = 1;
  SafeInt<unsigned_long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffd80.m_int,
             (int *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
             CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int));
  local_c = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int));
  bits_03.m_int._4_4_ = in_stack_fffffffffffffd8c;
  bits_03.m_int._0_4_ = in_stack_fffffffffffffd88;
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffd80.m_int,bits_03);
  local_c = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int));
  bits_01.m_int._4_4_ = in_stack_fffffffffffffd7c;
  bits_01.m_int._0_4_ = in_stack_fffffffffffffd78;
  operator<<(in_stack_fffffffffffffd74.m_int,bits_01);
  local_c = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int));
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int),
             in_stack_fffffffffffffd68.m_int);
  bits.m_int._4_4_ = in_stack_fffffffffffffd74.m_int;
  bits.m_int._0_4_ = in_stack_fffffffffffffd70.m_int;
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffd68.m_int,bits);
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
             CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int));
  local_c = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int));
  bits_04.m_int._4_4_ = in_stack_fffffffffffffd8c;
  bits_04.m_int._0_4_ = in_stack_fffffffffffffd88;
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffd80.m_int,bits_04);
  local_c = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int));
  bits_02.m_int._4_4_ = in_stack_fffffffffffffd7c;
  bits_02.m_int._0_4_ = in_stack_fffffffffffffd78;
  operator>>(in_stack_fffffffffffffd74.m_int,bits_02);
  local_c = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int));
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int),
             in_stack_fffffffffffffd68.m_int);
  bits_00.m_int._4_4_ = in_stack_fffffffffffffd74.m_int;
  bits_00.m_int._0_4_ = in_stack_fffffffffffffd70.m_int;
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffd68.m_int,bits_00);
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator&
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffd68.m_int,in_stack_fffffffffffffd70);
  local_c = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int));
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator&
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
             CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int));
  local_c = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int));
  rhs.m_int._4_4_ = in_stack_fffffffffffffd7c;
  rhs.m_int._0_4_ = in_stack_fffffffffffffd78;
  operator&(in_stack_fffffffffffffd74.m_int,rhs);
  local_c = SafeInt::operator_cast_to_int
                      ((SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int))
  ;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator&=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffd68.m_int,in_stack_fffffffffffffd74);
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator&=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int),
             in_stack_fffffffffffffd68.m_int);
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator&=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),in_stack_fffffffffffffd80
            );
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator|
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffd68.m_int,in_stack_fffffffffffffd70);
  local_c = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int));
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator|
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
             CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int));
  local_c = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int));
  rhs_00.m_int._4_4_ = in_stack_fffffffffffffd7c;
  rhs_00.m_int._0_4_ = in_stack_fffffffffffffd78;
  operator|(in_stack_fffffffffffffd74.m_int,rhs_00);
  local_c = SafeInt::operator_cast_to_int
                      ((SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int))
  ;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator|=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffd68.m_int,in_stack_fffffffffffffd74);
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator|=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int),
             in_stack_fffffffffffffd68.m_int);
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator|=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),in_stack_fffffffffffffd80
            );
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator^
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffd68.m_int,in_stack_fffffffffffffd70);
  local_c = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int));
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator^
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
             CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int));
  local_c = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int));
  rhs_01.m_int._4_4_ = in_stack_fffffffffffffd7c;
  rhs_01.m_int._0_4_ = in_stack_fffffffffffffd78;
  operator^(in_stack_fffffffffffffd74.m_int,rhs_01);
  local_c = SafeInt::operator_cast_to_int
                      ((SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int))
  ;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator^=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffd68.m_int,in_stack_fffffffffffffd74);
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator^=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffd74.m_int,in_stack_fffffffffffffd70.m_int),
             in_stack_fffffffffffffd68.m_int);
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator^=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),in_stack_fffffffffffffd80
            );
  local_d = operator<(in_stack_fffffffffffffd74,in_stack_fffffffffffffd68);
  local_d = operator<(in_stack_fffffffffffffd74,in_stack_fffffffffffffd68.m_int);
  local_d = operator<(in_stack_fffffffffffffd68.m_int,in_stack_fffffffffffffd74);
  local_d = operator<(in_stack_fffffffffffffd74,in_stack_fffffffffffffd68);
  local_d = operator<=(in_stack_fffffffffffffd74,in_stack_fffffffffffffd68);
  local_d = operator<=(in_stack_fffffffffffffd74,in_stack_fffffffffffffd68.m_int);
  local_d = operator<=(in_stack_fffffffffffffd68.m_int,in_stack_fffffffffffffd74);
  local_d = operator<=(in_stack_fffffffffffffd74,in_stack_fffffffffffffd68);
  local_d = operator>(in_stack_fffffffffffffd74,in_stack_fffffffffffffd68);
  local_d = operator>(in_stack_fffffffffffffd74,in_stack_fffffffffffffd68.m_int);
  local_d = operator>(in_stack_fffffffffffffd68.m_int,in_stack_fffffffffffffd74);
  local_d = operator>(in_stack_fffffffffffffd74,in_stack_fffffffffffffd68);
  local_d = operator>=(in_stack_fffffffffffffd74,in_stack_fffffffffffffd68);
  local_d = operator>=(in_stack_fffffffffffffd74,in_stack_fffffffffffffd68.m_int);
  local_d = operator>=(in_stack_fffffffffffffd68.m_int,in_stack_fffffffffffffd74);
  local_d = operator>=(in_stack_fffffffffffffd74,in_stack_fffffffffffffd68);
  local_d = operator==(in_stack_fffffffffffffd74,in_stack_fffffffffffffd68);
  local_d = operator==(in_stack_fffffffffffffd74,in_stack_fffffffffffffd68.m_int);
  local_d = operator==(in_stack_fffffffffffffd68.m_int,in_stack_fffffffffffffd74);
  operator==(local_14,local_20);
  return;
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}